

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O1

Collator * icu_63::Collator::makeInstance(Locale *desiredLocale,UErrorCode *status)

{
  CollationCacheEntry *entry;
  RuleBasedCollator *this;
  UErrorCode *size;
  
  size = status;
  entry = CollationLoader::loadTailoring(desiredLocale,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = (RuleBasedCollator *)UMemory::operator_new((UMemory *)0x110,(size_t)size);
    if (this == (RuleBasedCollator *)0x0) {
      this = (RuleBasedCollator *)0x0;
    }
    else {
      RuleBasedCollator::RuleBasedCollator(this,entry);
    }
    if (this != (RuleBasedCollator *)0x0) {
      SharedObject::removeRef(&entry->super_SharedObject);
      return &this->super_Collator;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  if (entry != (CollationCacheEntry *)0x0) {
    SharedObject::removeRef(&entry->super_SharedObject);
  }
  return (Collator *)0x0;
}

Assistant:

Collator* Collator::makeInstance(const Locale&  desiredLocale, UErrorCode& status) {
    const CollationCacheEntry *entry = CollationLoader::loadTailoring(desiredLocale, status);
    if (U_SUCCESS(status)) {
        Collator *result = new RuleBasedCollator(entry);
        if (result != NULL) {
            // Both the unified cache's get() and the RBC constructor
            // did addRef(). Undo one of them.
            entry->removeRef();
            return result;
        }
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (entry != NULL) {
        // Undo the addRef() from the cache.get().
        entry->removeRef();
    }
    return NULL;
}